

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O3

int TBufferNewPage(VP8TBuffer *b)

{
  VP8Tokens *pVVar1;
  
  if ((b->error == 0) &&
     (pVVar1 = (VP8Tokens *)WebPSafeMalloc(1,(long)b->page_size * 2 + 8), pVVar1 != (VP8Tokens *)0x0
     )) {
    pVVar1->next = (VP8Tokens *)0x0;
    *b->last_page = pVVar1;
    b->last_page = (VP8Tokens **)pVVar1;
    b->left = b->page_size;
    b->tokens = (uint16_t *)(pVVar1 + 1);
    return 1;
  }
  b->error = 1;
  return 0;
}

Assistant:

static int TBufferNewPage(VP8TBuffer* const b) {
  VP8Tokens* page = NULL;
  if (!b->error) {
    const size_t size = sizeof(*page) + b->page_size * sizeof(token_t);
    page = (VP8Tokens*)WebPSafeMalloc(1ULL, size);
  }
  if (page == NULL) {
    b->error = 1;
    return 0;
  }
  page->next = NULL;

  *b->last_page = page;
  b->last_page = &page->next;
  b->left = b->page_size;
  b->tokens = (token_t*)TOKEN_DATA(page);
  return 1;
}